

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTcPrsOpAdd::eval_constant(CTcPrsOpAdd *this,CTcPrsNode *left,CTcPrsNode *right)

{
  CTPNListBase *this_00;
  size_t __n;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsNode *pCVar3;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *__src;
  undefined4 extraout_var_06;
  char *__src_00;
  void *__dest;
  undefined4 *puVar4;
  long lVar5;
  size_t len2;
  size_t len1;
  char buf2 [128];
  char buf1 [128];
  size_t local_150;
  size_t local_148;
  size_t local_140;
  char local_138 [128];
  char local_b8 [136];
  undefined4 extraout_var_07;
  
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    return (CTcPrsNode *)0x0;
  }
  iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    return (CTcPrsNode *)0x0;
  }
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  iVar1 = *(int *)CONCAT44(extraout_var_01,iVar1);
  iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
  iVar2 = *(int *)CONCAT44(extraout_var_02,iVar2);
  if (iVar1 != 0xd) {
    if (iVar1 == 6) goto LAB_001fdb6c;
    if (iVar1 != 3) goto LAB_001fdba6;
  }
  if ((iVar2 == 0xd) || (iVar2 == 3)) {
    pCVar3 = CTcPrsOpArith::eval_constant(&this->super_CTcPrsOpArith,left,right);
    return pCVar3;
  }
  if (iVar1 != 6) {
LAB_001fdba6:
    if ((iVar1 == 4) || (iVar2 == 4)) {
      if (iVar2 != 6) {
        iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
        __src = CTcConstVal::cvt_to_str
                          ((CTcConstVal *)CONCAT44(extraout_var_05,iVar1),local_b8,0x80,&local_140);
        iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
        __src_00 = CTcConstVal::cvt_to_str
                             ((CTcConstVal *)CONCAT44(extraout_var_06,iVar1),local_138,0x80,
                              &local_150);
        if (iVar2 == 1) {
          local_150 = 0;
          __src = "";
        }
        __n = local_150;
        if (((__src_00 != (char *)0x0) && (__src != (char *)0x0)) &&
           (__dest = CTcPrsMem::alloc(G_prsmem,local_140 + 1 + local_150), __dest != (void *)0x0)) {
          local_148 = __n + local_140;
          memcpy(__dest,__src,local_140);
          memcpy((void *)((long)__dest + local_140),__src_00,__n);
          *(undefined1 *)(__n + (long)((long)__dest + local_140)) = 0;
          iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
          puVar4 = (undefined4 *)CONCAT44(extraout_var_07,iVar1);
          *puVar4 = 4;
          *(void **)(puVar4 + 2) = __dest;
          *(size_t *)(puVar4 + 4) = local_148;
          CTcGenTarg::note_str(G_cg,local_148);
          return left;
        }
      }
    }
    else if (iVar1 != 7) {
      CTcTokenizer::log_error(0x2b03);
      return (CTcPrsNode *)0x0;
    }
    return (CTcPrsNode *)0x0;
  }
LAB_001fdb6c:
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  this_00 = *(CTPNListBase **)(CONCAT44(extraout_var_03,iVar1) + 8);
  if (iVar2 == 6) {
    iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
    for (lVar5 = *(long *)(*(long *)(CONCAT44(extraout_var_04,iVar1) + 8) + 0x10); lVar5 != 0;
        lVar5 = *(long *)(lVar5 + 0x10)) {
      CTPNListBase::add_element(this_00,*(CTcPrsNode **)(lVar5 + 8));
    }
  }
  else {
    CTPNListBase::add_element(this_00,right);
  }
  CTcGenTarg::note_list(G_cg,(long)this_00->cnt_);
  return left;
}

Assistant:

CTcPrsNode *CTcPrsOpAdd::eval_constant(CTcPrsNode *left,
                                       CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const() && right->is_const())
    {
        tc_constval_type_t typ1, typ2;

        /* get the types */
        typ1 = left->get_const_val()->get_type();
        typ2 = right->get_const_val()->get_type();
        
        /* check our types */
        if ((typ1 == TC_CVT_INT || typ1 == TC_CVT_FLOAT)
            && (typ2 == TC_CVT_INT || typ2 == TC_CVT_FLOAT))
        {
            /* int/float plus int/float - use the inherited handling */
            return CTcPrsOpArith::eval_constant(left, right);
        }
        else if (typ1 == TC_CVT_LIST)
        {
            /* get the original list */
            CTPNList *lst = left->get_const_val()->get_val_list();

            /* 
             *   if the right side is also a list, concatenate it onto the
             *   left list; otherwise, just add the right side as a new
             *   element to the existing list 
             */
            if (typ2 == TC_CVT_LIST)
            {
                CTPNListEle *ele;
                
                /* scan the list, adding each element */
                for (ele = right->get_const_val()
                           ->get_val_list()->get_head() ;
                     ele != 0 ; ele = ele->get_next())
                {
                    /* add this element's underlying expression value */
                    lst->add_element(ele->get_expr());
                }
            }
            else
            {
                /* add a new list element for the right side */
                lst->add_element(right);
            }

            /* 
             *   this list is longer than the original(s); tell the parser
             *   about it in case it's the longest list yet 
             */
            G_cg->note_list(lst->get_count());
        }
        else if (typ1 == TC_CVT_SSTR || typ2 == TC_CVT_SSTR)
        {
            char buf1[128];
            char buf2[128];
            const char *str1, *str2;
            size_t len1, len2;
            char *new_str;

            /* if the second value is a list, we can't make a constant */
            if (typ2 == TC_CVT_LIST)
                return 0;
            
            /* convert both values to strings if they're not already */
            str1 = left->get_const_val()
                   ->cvt_to_str(buf1, sizeof(buf1), &len1);
            str2 = right->get_const_val()
                   ->cvt_to_str(buf2, sizeof(buf2), &len2);

            /* treat nil as an empty string */
            if (typ2 == TC_CVT_NIL)
                str1 = "", len2 = 0;

            /* 
             *   if we couldn't convert one or the other, leave the result
             *   non-constant 
             */
            if (str1 == 0 || str2 == 0)
                return 0;
            
            /* 
             *   allocate space in the node pool for the concatenation of
             *   the two strings - if that fails, don't bother with the
             *   concatenation 
             */
            new_str = (char *)G_prsmem->alloc(len1 + len2 + 1);
            if (new_str == 0)
                return 0;

            /* copy the two string values into the new space */
            memcpy(new_str, str1, len1);
            memcpy(new_str + len1, str2, len2);
            new_str[len1 + len2] = '\0';

            /* set the new value in the left node */
            left->get_const_val()->set_sstr(new_str, len1 + len2);
        }
        else if (typ1 == TC_CVT_OBJ)
        {
            /* 
             *   assume it's an overloaded operator, in which case constant
             *   evaluation isn't possible, but it could still be a legal
             *   expression 
             */
            return 0;
        }
        else
        {
            /* these types are incompatible - log an error */
            G_tok->log_error(TCERR_CONST_BINPLUS_INCOMPAT);
            return 0;
        }

        /* return the updated left value */
        return left;
    }
    else
    {
        /* the values aren't constant, so the result isn't constant */
        return 0;
    }
}